

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_display.cpp
# Opt level: O0

size_t __thiscall cppurses::Text_display::display_height(Text_display *this)

{
  size_t sVar1;
  size_t sVar2;
  undefined8 local_18;
  size_t difference;
  Text_display *this_local;
  
  sVar1 = last_line(this);
  sVar2 = top_line(this);
  local_18 = (sVar1 + 1) - sVar2;
  sVar1 = Widget::height(&this->super_Widget);
  if (sVar1 < local_18) {
    local_18 = Widget::height(&this->super_Widget);
  }
  return local_18;
}

Assistant:

std::size_t Text_display::display_height() const {
    auto difference = 1 + this->last_line() - this->top_line();
    if (difference > this->height()) {
        difference = this->height();
    }
    return difference;
}